

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDecoder.cpp
# Opt level: O0

optional<std::array<int,_3UL>_>
ZXing::DataMatrix::DecodedBitStreamParser::DecodeNextTriple(BitSource *bits)

{
  int iVar1;
  int c;
  int b;
  int a;
  int fullBitValue;
  int firstByte;
  array<int,_3UL> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 local_10 [16];
  
  iVar1 = BitSource::available
                    ((BitSource *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (iVar1 < 0x10) {
    std::optional<std::array<int,_3UL>_>::optional((optional<std::array<int,_3UL>_> *)0x26ba92);
  }
  else {
    iVar1 = BitSource::readBits((BitSource *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                in_stack_ffffffffffffffcc);
    if (iVar1 == 0xfe) {
      std::optional<std::array<int,_3UL>_>::optional((optional<std::array<int,_3UL>_> *)0x26babe);
    }
    else {
      iVar1 = iVar1 << 8;
      BitSource::readBits((BitSource *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                          ,in_stack_ffffffffffffffcc);
      std::optional<std::array<int,_3UL>_>::optional<std::array<int,_3UL>,_true>
                ((optional<std::array<int,_3UL>_> *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    }
  }
  return (_Optional_base<std::array<int,_3UL>,_true,_true>)
         (_Optional_base<std::array<int,_3UL>,_true,_true>)local_10;
}

Assistant:

std::optional<std::array<int, 3>> DecodeNextTriple(BitSource& bits)
{
	// Values are encoded in a 16-bit value as (1600 * C1) + (40 * C2) + C3 + 1
	// If there is less than 2 bytes left or the next byte is the unlatch codeword then the current segment has ended
	if (bits.available() < 16)
		return {};
	int firstByte = bits.readBits(8);
	if (firstByte == 254) // Unlatch codeword
		return {};

	int fullBitValue = (firstByte << 8) + bits.readBits(8) - 1;
	int a = fullBitValue / 1600;
	fullBitValue -= a * 1600;
	int b = fullBitValue / 40;
	int c = fullBitValue - b * 40;

	return {{a, b, c}};
}